

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

int Gia_ManSatEnum(Gia_Man_t *pGia,int nConfLimit,int nTimeOut,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *p;
  sat_solver *s;
  Vec_Int_t *p_00;
  int *piVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  char *__format;
  int iVar8;
  ulong uVar9;
  timespec ts;
  timespec local_80;
  uint local_70;
  uint local_6c;
  long local_68;
  ulong local_60;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  ulong local_40;
  ABC_INT64_T local_38;
  
  local_70 = nConfLimit;
  local_50 = fVerbose;
  iVar2 = clock_gettime(3,&local_80);
  if (iVar2 < 0) {
    local_68 = -1;
  }
  else {
    local_68 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  local_6c = 1;
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,0);
  iVar2 = p->nVars;
  iVar3 = pGia->vCis->nSize;
  local_60 = (ulong)(uint)pGia->nRegs;
  Cnf_DataFree(p);
  iVar8 = pGia->vCis->nSize - pGia->nRegs;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar6 = iVar8;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar6 << 2);
  }
  p_00->pArray = piVar4;
  local_38 = (ABC_INT64_T)(int)local_70;
  uVar7 = (iVar2 - iVar3) + (int)local_60;
  local_40 = (ulong)uVar7;
  local_48 = (long)nTimeOut;
  local_54 = uVar7 * 2;
  local_60 = (ulong)(uint)(((int)local_60 + iVar2) - iVar3);
  uVar7 = 0;
  iVar2 = 0;
  do {
    iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,local_38,0,0,0);
    if (iVar3 == -1) {
LAB_0078c902:
      bVar1 = false;
      iVar2 = 1;
    }
    else if (iVar3 == 0) {
      iVar2 = 0;
      bVar1 = false;
    }
    else {
      p_00->nSize = 0;
      local_4c = iVar2;
      if (pGia->nRegs < pGia->vCis->nSize) {
        lVar5 = 0;
        uVar9 = local_40;
        iVar2 = local_54;
        do {
          if (((int)uVar9 < 0) || (s->size <= (int)local_60 + (int)lVar5)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          Vec_IntPush(p_00,(uint)(s->model[uVar9] == 1) + iVar2);
          lVar5 = lVar5 + 1;
          iVar2 = iVar2 + 2;
          uVar9 = uVar9 + 1;
        } while (lVar5 < (long)pGia->vCis->nSize - (long)pGia->nRegs);
      }
      if (local_50 != 0) {
        printf("%5d : ",(ulong)local_6c);
        iVar2 = p_00->nSize;
        if (0 < (long)iVar2) {
          piVar4 = p_00->pArray;
          lVar5 = 0;
          do {
            if (piVar4[lVar5] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            printf("%d",(ulong)(~piVar4[lVar5] & 1));
            lVar5 = lVar5 + 1;
          } while (iVar2 != lVar5);
        }
        putchar(10);
      }
      uVar7 = uVar7 + 1;
      iVar3 = sat_solver_addclause(s,p_00->pArray,p_00->pArray + p_00->nSize);
      iVar2 = local_4c;
      if (iVar3 == 0) goto LAB_0078c902;
      if (nTimeOut != 0) {
        iVar3 = clock_gettime(3,&local_80);
        if (iVar3 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
        }
        bVar1 = false;
        if (local_48 <= (lVar5 - local_68) / 1000000) {
          iVar2 = 0;
          goto LAB_0078c941;
        }
      }
      bVar1 = true;
    }
LAB_0078c941:
    local_6c = local_6c + 1;
  } while (bVar1);
  sat_solver_delete(s);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (nTimeOut == 0) {
LAB_0078c9e9:
    if (iVar2 != 0 || local_70 == 0) {
      printf("Enumerated the complete set of %d assignments.  ",(ulong)uVar7);
      goto LAB_0078ca2f;
    }
    __format = "Enumerated %d assignments when conflict limit (%d) was reached.  ";
    nTimeOut = local_70;
  }
  else {
    iVar3 = clock_gettime(3,&local_80);
    if (iVar3 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    if ((lVar5 - local_68) / 1000000 < local_48) goto LAB_0078c9e9;
    __format = "Enumerated %d assignments when timeout (%d sec) was reached.  ";
  }
  printf(__format,(ulong)uVar7,(ulong)(uint)nTimeOut);
LAB_0078ca2f:
  iVar6 = 3;
  iVar3 = clock_gettime(3,&local_80);
  if (iVar3 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
  }
  lVar5 = lVar5 - local_68;
  Abc_Print(iVar6,"%s =","Time");
  Abc_Print(iVar6,"%9.2f sec\n",(double)lVar5 / 1000000.0);
  return iVar2;
}

Assistant:

int Gia_ManSatEnum( Gia_Man_t * pGia, int nConfLimit, int nTimeOut, int fVerbose )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int i, iLit, iParVarBeg, Iter;
    int nSolutions = 0, RetValue = 0;
    abctime clkStart = Abc_Clock();
    pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iParVarBeg = pCnf->nVars - Gia_ManPiNum(pGia);// - 1;
    Cnf_DataFree( pCnf );
    // iterate through the SAT assignment
    vLits = Vec_IntAlloc( Gia_ManPiNum(pGia) );
    for ( Iter = 1 ; ; Iter++ )
    {
        int status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, 0, 0, 0 );
        if ( status == l_False ) { RetValue =  1; break; }
        if ( status == l_Undef ) { RetValue =  0; break; }
        nSolutions++;
        // extract SAT assignment
        Vec_IntClear( vLits );
        for ( i = 0; i < Gia_ManPiNum(pGia); i++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iParVarBeg+i, sat_solver_var_value(pSat, iParVarBeg+i)) );
        if ( fVerbose )
        {
            printf( "%5d : ", Iter );
            Vec_IntForEachEntry( vLits, iLit, i )
                printf( "%d", !Abc_LitIsCompl(iLit) );
            printf( "\n" );
        }
        // add clause
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) ) )
            { RetValue =  1; break; }
        if ( nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= nTimeOut ) { RetValue = 0; break; }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    if ( nTimeOut && (Abc_Clock() - clkStart)/CLOCKS_PER_SEC >= nTimeOut )
        printf( "Enumerated %d assignments when timeout (%d sec) was reached.  ", nSolutions, nTimeOut );
    else if ( nConfLimit && !RetValue )
        printf( "Enumerated %d assignments when conflict limit (%d) was reached.  ", nSolutions, nConfLimit );
    else 
        printf( "Enumerated the complete set of %d assignments.  ", nSolutions );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
    return RetValue;
}